

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderSwitchTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalSwitchDynamic(ShaderEvalContext *evalCtx)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  Vector<float,_3> local_30;
  VecAccess<float,_4,_3> local_20;
  
  fVar1 = (evalCtx->coords).m_data[2];
  fVar3 = floorf(fVar1 * 1.5 + 2.0);
  local_30.m_data[1] = fVar1;
  switch((int)fVar3) {
  case 0:
    uVar2 = *(undefined8 *)(evalCtx->coords).m_data;
    local_30.m_data[0] = (float)uVar2;
    local_30.m_data[1] = (float)((ulong)uVar2 >> 0x20);
    local_30.m_data[2] = fVar1;
    break;
  case 1:
    local_30.m_data[0] = (evalCtx->coords).m_data[3];
    local_30.m_data[2] = (evalCtx->coords).m_data[1];
    break;
  case 2:
    local_30.m_data[0] = (evalCtx->coords).m_data[1];
    local_30.m_data[2] = (evalCtx->coords).m_data[3];
    break;
  case 3:
    uVar2 = *(undefined8 *)(evalCtx->coords).m_data;
    local_30.m_data[0] = fVar1;
    local_30.m_data[1] = (float)((ulong)uVar2 >> 0x20);
    local_30.m_data[2] = (float)uVar2;
    break;
  default:
    local_30.m_data[0] = (evalCtx->coords).m_data[0];
    local_30.m_data[1] = local_30.m_data[0];
    local_30.m_data[2] = local_30.m_data[0];
  }
  local_20.m_vector = &evalCtx->color;
  local_20.m_index[0] = 0;
  local_20.m_index[1] = 1;
  local_20.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_20,&local_30);
  return;
}

Assistant:

static void evalSwitchDynamic	(ShaderEvalContext& evalCtx)
{
	switch (int(deFloatFloor(evalCtx.coords.z()*1.5f + 2.0f)))
	{
		case 0:		evalCtx.color.xyz() = evalCtx.coords.swizzle(0,1,2);	break;
		case 1:		evalCtx.color.xyz() = evalCtx.coords.swizzle(3,2,1);	break;
		case 2:		evalCtx.color.xyz() = evalCtx.coords.swizzle(1,2,3);	break;
		case 3:		evalCtx.color.xyz() = evalCtx.coords.swizzle(2,1,0);	break;
		default:	evalCtx.color.xyz() = evalCtx.coords.swizzle(0,0,0);	break;
	}
}